

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[40],unsigned_char,char[39],unsigned_int,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [40],uchar *RestArgs,char (*RestArgs_1) [39],uint *RestArgs_2,
               char (*RestArgs_3) [2])

{
  size_t sVar1;
  uchar local_39;
  char (*local_38) [2];
  
  local_38 = RestArgs_3;
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  local_39 = *RestArgs;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),(char *)&local_39,1);
  FormatStrSS<std::__cxx11::stringstream,char[39],unsigned_int,char[2]>
            (ss,RestArgs_1,RestArgs_2,local_38);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}